

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_create_map_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  void *pvVar1;
  JSValueUnion JVar2;
  JSValueUnion *pJVar3;
  ulong uVar4;
  ulong uVar5;
  JSValueUnion JVar7;
  JSRefCountHeader *p;
  JSValue JVar8;
  ulong uVar6;
  
  JVar7 = this_val.u;
  pvVar1 = JS_GetOpaque2(ctx,this_val,(magic & 3U) + 0x1f);
  uVar6 = 6;
  if (pvVar1 == (void *)0x0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    JVar8 = JS_NewObjectClass(ctx,(magic & 3U) + 0x23);
    uVar6 = JVar8.tag;
    JVar2 = JVar8.u;
    if ((uVar6 & 0xffffffff) != 6) {
      pJVar3 = (JSValueUnion *)js_malloc(ctx,0x20);
      if (pJVar3 != (JSValueUnion *)0x0) {
        if (0xfffffff4 < (uint)this_val.tag) {
          *(int *)JVar7.ptr = *JVar7.ptr + 1;
        }
        pJVar3->ptr = (void *)JVar7;
        pJVar3[1] = (JSValueUnion)this_val.tag;
        pJVar3[2].int32 = magic >> 2;
        pJVar3[3].float64 = 0.0;
        if ((int)JVar8.tag == -1) {
          *(JSValueUnion **)((long)JVar2.ptr + 0x30) = pJVar3;
        }
        uVar5 = (ulong)JVar2.ptr & 0xffffffff00000000;
        uVar4 = (ulong)JVar2.ptr & 0xffffffff;
        goto LAB_0013bad7;
      }
      JS_FreeValue(ctx,JVar8);
    }
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 6;
  }
LAB_0013bad7:
  JVar8.u.ptr = (void *)(uVar4 | uVar5);
  JVar8.tag = uVar6;
  return JVar8;
}

Assistant:

static JSValue js_create_map_iterator(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    JSIteratorKindEnum kind;
    JSMapState *s;
    JSMapIteratorData *it;
    JSValue enum_obj;

    kind = magic >> 2;
    magic &= 3;
    s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    enum_obj = JS_NewObjectClass(ctx, JS_CLASS_MAP_ITERATOR + magic);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it) {
        JS_FreeValue(ctx, enum_obj);
        goto fail;
    }
    it->obj = JS_DupValue(ctx, this_val);
    it->kind = kind;
    it->cur_record = NULL;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail:
    return JS_EXCEPTION;
}